

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.cpp
# Opt level: O1

string * __thiscall
ami_nvar_t::nvar_entry_body_t::extended_header_hash_abi_cxx11_
          (string *__return_storage_ptr__,nvar_entry_body_t *this)

{
  nvar_attributes_t *pnVar1;
  kstream *this_00;
  pointer pcVar2;
  uint16_t uVar3;
  nvar_extended_attributes_t *pnVar4;
  uint64_t pos;
  uint64_t uVar5;
  string local_48;
  
  if (this->f_extended_header_hash == false) {
    this->n_extended_header_hash = true;
    pnVar1 = (this->m__parent->m_attributes)._M_t.
             super___uniq_ptr_impl<ami_nvar_t::nvar_attributes_t,_std::default_delete<ami_nvar_t::nvar_attributes_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_ami_nvar_t::nvar_attributes_t_*,_std::default_delete<ami_nvar_t::nvar_attributes_t>_>
             .super__Head_base<0UL,_ami_nvar_t::nvar_attributes_t_*,_false>._M_head_impl;
    if ((pnVar1->m_valid == true) && (pnVar1->m_extended_header == true)) {
      uVar3 = extended_header_size(this);
      if (0x2a < uVar3) {
        pnVar4 = extended_header_attributes(this);
        if ((pnVar4->m_time_based_auth == true) &&
           (((this->m__parent->m_attributes)._M_t.
             super___uniq_ptr_impl<ami_nvar_t::nvar_attributes_t,_std::default_delete<ami_nvar_t::nvar_attributes_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_ami_nvar_t::nvar_attributes_t_*,_std::default_delete<ami_nvar_t::nvar_attributes_t>_>
             .super__Head_base<0UL,_ami_nvar_t::nvar_attributes_t_*,_false>._M_head_impl)->
            m_data_only == false)) {
          this->n_extended_header_hash = false;
          pos = kaitai::kstream::pos((this->super_kstruct).m__io);
          this_00 = (this->super_kstruct).m__io;
          uVar5 = kaitai::kstream::pos(this_00);
          uVar3 = extended_header_size(this);
          kaitai::kstream::seek(this_00,(uVar5 - uVar3) + 9);
          kaitai::kstream::read_bytes_abi_cxx11_(&local_48,(this->super_kstruct).m__io,0x20);
          std::__cxx11::string::operator=
                    ((string *)&this->m_extended_header_hash,(string *)&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != &local_48.field_2) {
            operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
          }
          kaitai::kstream::seek((this->super_kstruct).m__io,pos);
          this->f_extended_header_hash = true;
        }
      }
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (this->m_extended_header_hash)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,
             pcVar2 + (this->m_extended_header_hash)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string ami_nvar_t::nvar_entry_body_t::extended_header_hash() {
    if (f_extended_header_hash)
        return m_extended_header_hash;
    n_extended_header_hash = true;
    if ( ((_parent()->attributes()->valid()) && (_parent()->attributes()->extended_header()) && (extended_header_size() >= (((1 + 8) + 32) + 2)) && (extended_header_attributes()->time_based_auth()) && (!(_parent()->attributes()->data_only()))) ) {
        n_extended_header_hash = false;
        std::streampos _pos = m__io->pos();
        m__io->seek((((_io()->pos() - extended_header_size()) + 1) + 8));
        m_extended_header_hash = m__io->read_bytes(32);
        m__io->seek(_pos);
        f_extended_header_hash = true;
    }
    return m_extended_header_hash;
}